

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

RenderContext * __thiscall
eglu::GLContextFactory::createContext
          (GLContextFactory *this,RenderConfig *config,CommandLine *cmdLine)

{
  NativeDisplayFactory *factory;
  NativeWindowFactory *windowFactory_00;
  NativePixmapFactory *pixmapFactory_00;
  RenderContext *this_00;
  NotSupportedError *anon_var_0_1;
  NotSupportedError *anon_var_0;
  NativePixmapFactory *pixmapFactory;
  NativeWindowFactory *windowFactory;
  NativeDisplayFactory *displayFactory;
  CommandLine *cmdLine_local;
  RenderConfig *config_local;
  GLContextFactory *this_local;
  
  factory = selectNativeDisplayFactory(this->m_displayFactoryRegistry,cmdLine);
  windowFactory_00 = selectNativeWindowFactory(factory,cmdLine);
  pixmapFactory_00 = selectNativePixmapFactory(factory,cmdLine);
  this_00 = (RenderContext *)operator_new(0x1ad8);
  anon_unknown_1::RenderContext::RenderContext
            (this_00,factory,windowFactory_00,pixmapFactory_00,config);
  return (RenderContext *)this_00;
}

Assistant:

glu::RenderContext* GLContextFactory::createContext (const glu::RenderConfig& config, const tcu::CommandLine& cmdLine) const
{
	const NativeDisplayFactory& displayFactory = selectNativeDisplayFactory(m_displayFactoryRegistry, cmdLine);

	const NativeWindowFactory*	windowFactory;
	const NativePixmapFactory*	pixmapFactory;

	try
	{
		windowFactory = &selectNativeWindowFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		windowFactory = DE_NULL;
	}

	try
	{
		pixmapFactory = &selectNativePixmapFactory(displayFactory, cmdLine);
	}
	catch (const tcu::NotSupportedError&)
	{
		pixmapFactory = DE_NULL;
	}

	return new RenderContext(&displayFactory, windowFactory, pixmapFactory, config);
}